

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

void Intra4Preds_C(uint8_t *dst,uint8_t *top)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint uVar19;
  uint uVar20;
  uint8_t *puVar21;
  uint8_t uVar22;
  long lVar23;
  uint8_t uVar24;
  uint8_t uVar25;
  uint uVar26;
  uint8_t uVar27;
  long lVar28;
  int D;
  uint8_t uVar29;
  int C;
  uint8_t uVar30;
  int X;
  uint8_t uVar31;
  uint8_t uVar32;
  uint8_t uVar33;
  undefined1 auVar34 [16];
  int L;
  
  uVar26 = 4;
  lVar23 = -5;
  while( true ) {
    if (lVar23 + 1 == 0) break;
    uVar26 = uVar26 + top[lVar23 + 5] + (uint)top[lVar23];
    lVar23 = lVar23 + 1;
  }
  Fill(dst + 0x600,uVar26 >> 3,4);
  puVar21 = dst + 0x604;
  bVar1 = top[-1];
  for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
    bVar2 = top[-2 - lVar23];
    for (lVar28 = 0; lVar28 != 4; lVar28 = lVar28 + 1) {
      puVar21[lVar28] = clip1[(ulong)top[lVar28] + (ulong)bVar2 + (0xff - (ulong)bVar1)];
    }
    puVar21 = puVar21 + 0x20;
  }
  bVar2 = *top;
  bVar3 = top[1];
  bVar4 = top[2];
  bVar5 = top[3];
  bVar6 = top[4];
  lVar23 = 0;
  while( true ) {
    uVar17 = (uint8_t)((uint)bVar3 + (uint)bVar4 * 2 + 2 + (uint)bVar5 >> 2);
    uVar22 = (uint8_t)((uint)bVar4 + (uint)bVar5 * 2 + 2 + (uint)bVar6 >> 2);
    uVar18 = (uint8_t)((uint)bVar2 + (uint)bVar3 * 2 + (uint)bVar4 + 2 >> 2);
    if (lVar23 == 0x80) break;
    dst[lVar23 + 0x608] = (uint8_t)((uint)bVar1 + (uint)bVar2 * 2 + (uint)bVar3 + 2 >> 2);
    dst[lVar23 + 0x609] = uVar18;
    dst[lVar23 + 0x60a] = uVar17;
    dst[lVar23 + 0x60b] = uVar22;
    lVar23 = lVar23 + 0x20;
  }
  bVar7 = top[-2];
  bVar8 = top[-3];
  *(uint *)(dst + 0x60c) = ((uint)bVar1 + (uint)bVar7 * 2 + (uint)bVar8 + 2 >> 2) * 0x1010101;
  bVar9 = top[-4];
  uVar19 = (uint)bVar7 + (uint)bVar8 * 2 + (uint)bVar9 + 2 >> 2;
  *(uint *)(dst + 0x62c) = uVar19 * 0x1010101;
  bVar10 = top[-5];
  uVar26 = (uint)bVar8 + (uint)bVar10 + (uint)bVar9 * 2 + 2 >> 2;
  *(uint *)(dst + 0x64c) = uVar26 * 0x1010101;
  uVar20 = (uint)bVar9 + (uint)bVar10 + 2 + (uint)bVar10 * 2 >> 2;
  *(uint *)(dst + 0x66c) = uVar20 * 0x1010101;
  uVar24 = (uint8_t)uVar26;
  dst[0x670] = uVar24;
  uVar13 = (uint8_t)((uint)bVar7 + (uint)bVar8 * 2 + 2 + (uint)bVar9 >> 2);
  dst[0x671] = uVar13;
  dst[0x650] = uVar13;
  uVar13 = (uint8_t)((uint)bVar1 + (uint)bVar7 * 2 + 2 + (uint)bVar8 >> 2);
  dst[0x672] = uVar13;
  dst[0x651] = uVar13;
  dst[0x630] = uVar13;
  uVar13 = (uint8_t)((uint)bVar2 + (uint)bVar1 * 2 + (uint)bVar7 + 2 >> 2);
  dst[0x673] = uVar13;
  dst[0x652] = uVar13;
  dst[0x631] = uVar13;
  dst[0x610] = uVar13;
  uVar14 = (uint8_t)((uint)bVar1 + (uint)bVar3 + 2 + (uint)bVar2 + (uint)bVar2 >> 2);
  dst[0x653] = uVar14;
  dst[0x632] = uVar14;
  dst[0x611] = uVar14;
  uVar14 = (uint8_t)((uint)bVar2 + (uint)bVar4 + 2 + (uint)bVar3 + (uint)bVar3 >> 2);
  dst[0x633] = uVar14;
  dst[0x612] = uVar14;
  dst[0x613] = (uint8_t)(bVar3 + 2 + (uint)bVar5 + (uint)bVar4 + (uint)bVar4 >> 2);
  uVar26 = (uint)bVar2;
  uVar14 = (uint8_t)(uVar26 + bVar1 + 1 >> 1);
  dst[0x655] = uVar14;
  dst[0x614] = uVar14;
  uVar14 = (uint8_t)(bVar3 + uVar26 + 1 >> 1);
  dst[0x656] = uVar14;
  dst[0x615] = uVar14;
  uVar30 = (uint8_t)((uint)bVar3 + (uint)bVar4 + 1 >> 1);
  dst[0x657] = uVar30;
  dst[0x616] = uVar30;
  uVar25 = (uint8_t)((uint)bVar5 + (uint)bVar4 + 1 >> 1);
  dst[0x617] = uVar25;
  uVar15 = (uint8_t)((uint)bVar9 + (uint)bVar7 + 2 + (uint)bVar8 * 2 >> 2);
  dst[0x674] = uVar15;
  uVar16 = (uint8_t)((uint)bVar1 + (uint)bVar8 + 2 + (uint)bVar7 * 2 >> 2);
  dst[0x654] = uVar16;
  dst[0x675] = uVar13;
  dst[0x634] = uVar13;
  uVar29 = (uint8_t)((uint)bVar2 + (uint)bVar2 + (uint)bVar1 + 2 + (uint)bVar3 >> 2);
  dst[0x676] = uVar29;
  dst[0x635] = uVar29;
  uVar33 = (uint8_t)((uint)bVar3 + (uint)bVar3 + uVar26 + 2 + (uint)bVar4 >> 2);
  dst[0x677] = uVar33;
  dst[0x636] = uVar33;
  dst[0x637] = uVar17;
  bVar2 = top[5];
  bVar11 = top[6];
  bVar12 = top[7];
  uVar26 = (uint)bVar5;
  dst[0x618] = uVar18;
  uVar17 = (uint8_t)((uint)bVar4 + (uint)bVar4 + (uint)bVar3 + uVar26 + 2 >> 2);
  dst[0x638] = uVar17;
  dst[0x619] = uVar17;
  dst[0x658] = uVar22;
  dst[0x639] = uVar22;
  dst[0x61a] = uVar22;
  uVar27 = (uint8_t)(uVar26 + (uint)bVar6 * 2 + 2 + (uint)bVar2 >> 2);
  dst[0x678] = uVar27;
  dst[0x659] = uVar27;
  dst[0x63a] = uVar27;
  dst[0x61b] = uVar27;
  uVar32 = (uint8_t)((uint)bVar6 + (uint)bVar2 * 2 + (uint)bVar11 + 2 >> 2);
  dst[0x679] = uVar32;
  dst[0x65a] = uVar32;
  dst[0x63b] = uVar32;
  uVar31 = (uint8_t)(bVar12 + 2 + (uint)bVar2 + (uint)bVar11 * 2 >> 2);
  dst[0x67a] = uVar31;
  dst[0x65b] = uVar31;
  dst[0x67b] = (uint8_t)((uint)bVar12 * 3 + 2 + (uint)bVar11 >> 2);
  dst[0x61c] = uVar14;
  dst[0x65c] = uVar30;
  dst[0x61d] = uVar30;
  dst[0x65d] = uVar25;
  dst[0x61e] = uVar25;
  uVar14 = (uint8_t)(uVar26 + bVar6 + 1 >> 1);
  dst[0x65e] = uVar14;
  dst[0x61f] = uVar14;
  dst[0x63c] = uVar18;
  dst[0x67c] = uVar17;
  dst[0x63d] = uVar17;
  dst[0x67d] = uVar22;
  dst[0x63e] = uVar22;
  dst[0x67e] = uVar27;
  dst[0x63f] = uVar27;
  dst[0x65f] = uVar32;
  dst[0x67f] = uVar31;
  uVar18 = (uint8_t)((uint)bVar7 + (uint)bVar1 + 1 >> 1);
  dst[0x6a2] = uVar18;
  dst[0x680] = uVar18;
  uVar18 = (uint8_t)((uint)bVar8 + (uint)bVar7 + 1 >> 1);
  dst[0x6c2] = uVar18;
  dst[0x6a0] = uVar18;
  uVar22 = (uint8_t)((uint)bVar8 + (uint)bVar9 + 1 >> 1);
  dst[0x6e2] = uVar22;
  dst[0x6c0] = uVar22;
  uVar17 = (uint8_t)((uint)bVar9 + (uint)bVar10 + 1 >> 1);
  dst[0x6e0] = uVar17;
  dst[0x683] = uVar33;
  dst[0x682] = uVar29;
  dst[0x6a3] = uVar13;
  dst[0x681] = uVar13;
  dst[0x6c3] = uVar16;
  dst[0x6a1] = uVar16;
  dst[0x6e3] = uVar15;
  dst[0x6c1] = uVar15;
  dst[0x6e1] = uVar24;
  dst[0x684] = uVar18;
  dst[0x6a4] = uVar22;
  dst[0x686] = uVar22;
  dst[0x6c4] = uVar17;
  dst[0x6a6] = uVar17;
  dst[0x685] = (uint8_t)uVar19;
  dst[0x6a5] = uVar24;
  dst[0x687] = uVar24;
  uVar18 = (uint8_t)uVar20;
  dst[0x6c5] = uVar18;
  dst[0x6a7] = uVar18;
  auVar34 = pshuflw(ZEXT216(CONCAT11(bVar10,bVar10)),ZEXT216(CONCAT11(bVar10,bVar10)),0);
  *(int *)(dst + 0x6e4) = auVar34._0_4_;
  dst[0x6c6] = bVar10;
  dst[0x6c7] = bVar10;
  return;
}

Assistant:

static void Intra4Preds_C(uint8_t* WEBP_RESTRICT dst,
                          const uint8_t* WEBP_RESTRICT top) {
  DC4(I4DC4 + dst, top);
  TM4(I4TM4 + dst, top);
  VE4(I4VE4 + dst, top);
  HE4(I4HE4 + dst, top);
  RD4(I4RD4 + dst, top);
  VR4(I4VR4 + dst, top);
  LD4(I4LD4 + dst, top);
  VL4(I4VL4 + dst, top);
  HD4(I4HD4 + dst, top);
  HU4(I4HU4 + dst, top);
}